

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,Descriptor *descriptor,
          bool immutable,bool kotlin)

{
  byte bVar1;
  bool bVar2;
  FileDescriptor *file;
  string local_58;
  string_view local_38;
  byte local_22;
  byte local_21;
  bool kotlin_local;
  Descriptor *pDStack_20;
  bool immutable_local;
  Descriptor *descriptor_local;
  ClassNameResolver *this_local;
  
  local_22 = kotlin;
  local_21 = immutable;
  pDStack_20 = descriptor;
  descriptor_local = (Descriptor *)this;
  this_local = (ClassNameResolver *)__return_storage_ptr__;
  java::(anonymous_namespace)::ClassNameWithoutPackage_abi_cxx11_
            (&local_58,(_anonymous_namespace_ *)descriptor,(Descriptor *)(ulong)(immutable & 1),
             immutable);
  local_38 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_58);
  file = Descriptor::file(pDStack_20);
  bVar1 = local_21;
  bVar2 = NestedInFileClass(pDStack_20,(bool)(local_21 & 1));
  GetClassFullName_abi_cxx11_
            (__return_storage_ptr__,this,local_38,file,(bool)(bVar1 & 1),(bool)(~bVar2 & 1),
             (bool)(local_22 & 1));
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetClassName(const Descriptor* descriptor,
                                            bool immutable, bool kotlin) {
  return GetClassFullName(ClassNameWithoutPackage(descriptor, immutable),
                          descriptor->file(), immutable,
                          !NestedInFileClass(*descriptor, immutable), kotlin);
}